

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenCallRefSetOperandAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef operandExpr)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Expression *expression;
  BinaryenExpressionRef operandExpr_local;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::CallRef>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<CallRef>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xfb2,
                  "void BinaryenCallRefSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     (expr + 1));
  if (index < sVar2) {
    if (operandExpr != (BinaryenExpressionRef)0x0) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (expr + 1),(ulong)index);
      *ppEVar3 = operandExpr;
      return;
    }
    __assert_fail("operandExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xfb4,
                  "void BinaryenCallRefSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  __assert_fail("index < static_cast<CallRef*>(expression)->operands.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xfb3,
                "void BinaryenCallRefSetOperandAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenCallRefSetOperandAt(BinaryenExpressionRef expr,
                                 BinaryenIndex index,
                                 BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallRef>());
  assert(index < static_cast<CallRef*>(expression)->operands.size());
  assert(operandExpr);
  static_cast<CallRef*>(expression)->operands[index] = (Expression*)operandExpr;
}